

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::CheckBuildSystem(cmake *this)

{
  pointer *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ostream *poVar5;
  char *pcVar6;
  cmGlobalGenerator *__p;
  pointer pcVar7;
  undefined4 extraout_var;
  pointer pcVar8;
  char *pcVar9;
  reference pbVar10;
  pointer pcVar11;
  string local_2968;
  undefined1 local_2948 [8];
  ostringstream msg_7;
  int local_27cc;
  undefined1 local_27c8 [4];
  int result_2;
  undefined1 local_27a8 [8];
  ostringstream msg_6;
  int local_262c;
  iterator iStack_2628;
  int result_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2620;
  undefined1 local_2618 [8];
  string out_oldest;
  iterator out;
  undefined1 local_25d0 [8];
  ostringstream msg_5;
  int local_2454;
  iterator iStack_2450;
  int result;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2448;
  undefined1 local_2440 [8];
  string dep_newest;
  iterator dep;
  undefined1 local_23f8 [8];
  ostringstream msg_4;
  allocator<char> local_2279;
  string local_2278;
  allocator<char> local_2251;
  string local_2250;
  allocator<char> local_2229;
  string local_2228;
  char *local_2208;
  char *outputsStr;
  string local_21f8;
  char *local_21d8;
  char *dependsStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  undefined1 local_2180 [8];
  ostringstream msg_3;
  string *p;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_1fe0;
  allocator<char> local_1fb9;
  string local_1fb8;
  char *local_1f98;
  char *productStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  products;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> lgd;
  undefined1 local_1f58 [8];
  cmMakefile mfd;
  allocator<char> local_1751;
  string local_1750;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_1730;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> ggd;
  string local_1720;
  char *local_1700;
  char *genName;
  string local_16f0;
  undefined1 local_16d0 [8];
  ostringstream msg_2;
  cmStateSnapshot local_1558;
  undefined1 local_1540 [8];
  cmMakefile mf;
  cmGlobalGenerator gg;
  allocator<char> local_731;
  string local_730;
  allocator<char> local_709;
  string local_708;
  undefined1 local_6e8 [8];
  cmake cm;
  ostringstream local_340 [8];
  ostringstream msg_1;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream msg;
  bool verbose;
  cmake *this_local;
  
  bVar1 = isCMakeVerbose();
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar2 = cmsys::SystemTools::FileExists(&this->CheckBuildSystemArgument);
    if (bVar2) {
      cmake((cmake *)local_6e8,RoleScript,Unknown);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"",&local_709);
      SetHomeDirectory((cmake *)local_6e8,&local_708);
      std::__cxx11::string::~string((string *)&local_708);
      std::allocator<char>::~allocator(&local_709);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"",&local_731);
      SetHomeOutputDirectory((cmake *)local_6e8,&local_730);
      std::__cxx11::string::~string((string *)&local_730);
      std::allocator<char>::~allocator(&local_731);
      GetCurrentSnapshot((cmStateSnapshot *)&gg.InstallTargetEnabled,(cmake *)local_6e8);
      cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&gg.InstallTargetEnabled);
      cmGlobalGenerator::cmGlobalGenerator
                ((cmGlobalGenerator *)&mf.IsSourceFileTryCompile,(cmake *)local_6e8);
      GetCurrentSnapshot(&local_1558,(cmake *)local_6e8);
      cmMakefile::cmMakefile
                ((cmMakefile *)local_1540,(cmGlobalGenerator *)&mf.IsSourceFileTryCompile,
                 &local_1558);
      bVar2 = cmMakefile::ReadListFile((cmMakefile *)local_1540,&this->CheckBuildSystemArgument);
      if ((!bVar2) || (bVar2 = cmSystemTools::GetErrorOccuredFlag(), bVar2)) {
        if (bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_16d0);
          poVar5 = std::operator<<((ostream *)local_16d0,"Re-run cmake error reading : ");
          poVar5 = std::operator<<(poVar5,(string *)&this->CheckBuildSystemArgument);
          std::operator<<(poVar5,"\n");
          std::__cxx11::ostringstream::str();
          cmSystemTools::Stdout(&local_16f0);
          std::__cxx11::string::~string((string *)&local_16f0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_16d0);
        }
        this_local._4_4_ = 1;
        genName._4_4_ = 1;
      }
      else {
        if ((this->ClearBuildSystem & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1720,"CMAKE_DEPENDS_GENERATOR",
                     (allocator<char> *)
                     ((long)&ggd._M_t.
                             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                             .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 7));
          pcVar6 = cmMakefile::GetDefinition((cmMakefile *)local_1540,&local_1720);
          std::__cxx11::string::~string((string *)&local_1720);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&ggd._M_t.
                             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                             .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 7));
          if ((pcVar6 == (char *)0x0) || (local_1700 = pcVar6, *pcVar6 == '\0')) {
            local_1700 = "Unix Makefiles";
          }
          pcVar6 = local_1700;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1750,pcVar6,&local_1751);
          __p = CreateGlobalGenerator(this,&local_1750);
          std::unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>>::
          unique_ptr<std::default_delete<cmGlobalGenerator>,void>
                    ((unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>> *)
                     &local_1730,__p);
          std::__cxx11::string::~string((string *)&local_1750);
          std::allocator<char>::~allocator(&local_1751);
          bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_1730);
          if (bVar2) {
            GetCurrentSnapshot((cmStateSnapshot *)&mfd.IsSourceFileTryCompile,(cmake *)local_6e8);
            cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&mfd.IsSourceFileTryCompile);
            pcVar7 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                     get(&local_1730);
            GetCurrentSnapshot((cmStateSnapshot *)&lgd,(cmake *)local_6e8);
            cmMakefile::cmMakefile((cmMakefile *)local_1f58,pcVar7,(cmStateSnapshot *)&lgd);
            pcVar7 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                     operator->(&local_1730);
            iVar3 = (*pcVar7->_vptr_cmGlobalGenerator[2])(pcVar7,local_1f58);
            this_00 = &products.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>::
            unique_ptr<std::default_delete<cmLocalGenerator>,void>
                      ((unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>> *)this_00
                       ,(pointer)CONCAT44(extraout_var,iVar3));
            pcVar8 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                     operator->((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                 *)this_00);
            (*pcVar8->_vptr_cmLocalGenerator[10])(pcVar8,local_1f58,(ulong)bVar1);
            std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::~unique_ptr
                      ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                       &products.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            cmMakefile::~cmMakefile((cmMakefile *)local_1f58);
          }
          std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
                    (&local_1730);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&productStr);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1fb8,"CMAKE_MAKEFILE_PRODUCTS",&local_1fb9);
        pcVar6 = cmMakefile::GetDefinition((cmMakefile *)local_1540,&local_1fb8);
        std::__cxx11::string::~string((string *)&local_1fb8);
        std::allocator<char>::~allocator(&local_1fb9);
        local_1f98 = pcVar6;
        if (pcVar6 != (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1fe0,pcVar6,(allocator<char> *)((long)&__range1 + 7));
          cmSystemTools::ExpandListArgument
                    (&local_1fe0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&productStr,false);
          std::__cxx11::string::~string((string *)&local_1fe0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
        }
        __end1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&productStr);
        p = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&productStr);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&p), bVar2) {
          pbVar10 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end1);
          bVar2 = cmsys::SystemTools::FileExists(pbVar10);
          if ((!bVar2) && (bVar2 = cmsys::SystemTools::FileIsSymlink(pbVar10), !bVar2)) {
            if (bVar1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2180);
              poVar5 = std::operator<<((ostream *)local_2180,"Re-run cmake, missing byproduct: ");
              poVar5 = std::operator<<(poVar5,(string *)pbVar10);
              std::operator<<(poVar5,"\n");
              std::__cxx11::ostringstream::str();
              cmSystemTools::Stdout
                        ((string *)
                         &depends.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::~string
                        ((string *)
                         &depends.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2180);
            }
            this_local._4_4_ = 1;
            genName._4_4_ = 1;
            goto LAB_002f69a9;
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&outputs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&dependsStr);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_21f8,"CMAKE_MAKEFILE_DEPENDS",
                   (allocator<char> *)((long)&outputsStr + 7));
        pcVar6 = cmMakefile::GetDefinition((cmMakefile *)local_1540,&local_21f8);
        std::__cxx11::string::~string((string *)&local_21f8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&outputsStr + 7));
        local_21d8 = pcVar6;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2228,"CMAKE_MAKEFILE_OUTPUTS",&local_2229);
        pcVar9 = cmMakefile::GetDefinition((cmMakefile *)local_1540,&local_2228);
        std::__cxx11::string::~string((string *)&local_2228);
        std::allocator<char>::~allocator(&local_2229);
        pcVar6 = local_21d8;
        local_2208 = pcVar9;
        if ((local_21d8 != (char *)0x0) && (pcVar9 != (char *)0x0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2250,pcVar6,&local_2251);
          cmSystemTools::ExpandListArgument
                    (&local_2250,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&outputs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
          std::__cxx11::string::~string((string *)&local_2250);
          std::allocator<char>::~allocator(&local_2251);
          pcVar6 = local_2208;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2278,pcVar6,&local_2279);
          cmSystemTools::ExpandListArgument
                    (&local_2278,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&dependsStr,false);
          std::__cxx11::string::~string((string *)&local_2278);
          std::allocator<char>::~allocator(&local_2279);
        }
        bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&outputs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((bVar2) ||
           (bVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&dependsStr), bVar2)) {
          if (bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_23f8);
            std::operator<<((ostream *)local_23f8,
                            "Re-run cmake no CMAKE_MAKEFILE_DEPENDS or CMAKE_MAKEFILE_OUTPUTS :\n");
            std::__cxx11::ostringstream::str();
            cmSystemTools::Stdout((string *)&dep);
            std::__cxx11::string::~string((string *)&dep);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_23f8);
          }
          this_local._4_4_ = 1;
          genName._4_4_ = 1;
        }
        else {
          dep_newest.field_2._8_8_ =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&outputs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_2448 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&dep_newest.field_2 + 8),0);
          pbVar10 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_2448);
          std::__cxx11::string::string((string *)local_2440,(string *)pbVar10);
          while( true ) {
            iStack_2450 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&outputs.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&dep_newest.field_2 + 8),&stack0xffffffffffffdbb0);
            if (!bVar2) break;
            local_2454 = 0;
            pcVar11 = std::unique_ptr<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>::
                      operator->(&this->FileTimeCache);
            pbVar10 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)((long)&dep_newest.field_2 + 8));
            bVar2 = cmFileTimeCache::Compare(pcVar11,(string *)local_2440,pbVar10,&local_2454);
            if (!bVar2) {
              if (bVar1) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_25d0);
                std::operator<<((ostream *)local_25d0,
                                "Re-run cmake: build system dependency is missing\n");
                std::__cxx11::ostringstream::str();
                cmSystemTools::Stdout((string *)&out);
                std::__cxx11::string::~string((string *)&out);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_25d0);
              }
              this_local._4_4_ = 1;
              genName._4_4_ = 1;
              goto LAB_002f6959;
            }
            if (local_2454 < 0) {
              pbVar10 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&dep_newest.field_2 + 8));
              std::__cxx11::string::operator=((string *)local_2440,(string *)pbVar10);
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&dep_newest.field_2 + 8));
          }
          out_oldest.field_2._8_8_ =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&dependsStr);
          local_2620 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&out_oldest.field_2 + 8),0);
          pbVar10 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_2620);
          std::__cxx11::string::string((string *)local_2618,(string *)pbVar10);
          while( true ) {
            iStack_2628 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&dependsStr);
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&out_oldest.field_2 + 8),&stack0xffffffffffffd9d8);
            if (!bVar2) break;
            local_262c = 0;
            pcVar11 = std::unique_ptr<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>::
                      operator->(&this->FileTimeCache);
            pbVar10 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)((long)&out_oldest.field_2 + 8));
            bVar2 = cmFileTimeCache::Compare(pcVar11,(string *)local_2618,pbVar10,&local_262c);
            if (!bVar2) {
              if (bVar1) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_27a8);
                std::operator<<((ostream *)local_27a8,
                                "Re-run cmake: build system output is missing\n");
                std::__cxx11::ostringstream::str();
                cmSystemTools::Stdout((string *)local_27c8);
                std::__cxx11::string::~string((string *)local_27c8);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_27a8);
              }
              this_local._4_4_ = 1;
              goto LAB_002f693d;
            }
            if (0 < local_262c) {
              pbVar10 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&out_oldest.field_2 + 8));
              std::__cxx11::string::operator=((string *)local_2618,(string *)pbVar10);
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&out_oldest.field_2 + 8));
          }
          local_27cc = 0;
          pcVar11 = std::unique_ptr<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>::
                    operator->(&this->FileTimeCache);
          bVar2 = cmFileTimeCache::Compare
                            (pcVar11,(string *)local_2618,(string *)local_2440,&local_27cc);
          if ((bVar2) && (-1 < local_27cc)) {
            this_local._4_4_ = 0;
          }
          else {
            if (bVar1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2948);
              poVar5 = std::operator<<((ostream *)local_2948,"Re-run cmake file: ");
              poVar5 = std::operator<<(poVar5,(string *)local_2618);
              poVar5 = std::operator<<(poVar5," older than: ");
              poVar5 = std::operator<<(poVar5,(string *)local_2440);
              std::operator<<(poVar5,"\n");
              std::__cxx11::ostringstream::str();
              cmSystemTools::Stdout(&local_2968);
              std::__cxx11::string::~string((string *)&local_2968);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2948);
            }
            this_local._4_4_ = 1;
          }
LAB_002f693d:
          genName._4_4_ = 1;
          std::__cxx11::string::~string((string *)local_2618);
LAB_002f6959:
          std::__cxx11::string::~string((string *)local_2440);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dependsStr);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&outputs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_002f69a9:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&productStr);
      }
      cmMakefile::~cmMakefile((cmMakefile *)local_1540);
      cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf.IsSourceFileTryCompile);
      ~cmake((cmake *)local_6e8);
    }
    else {
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_340);
        poVar5 = std::operator<<((ostream *)local_340,"Re-run cmake missing file: ");
        poVar5 = std::operator<<(poVar5,(string *)&this->CheckBuildSystemArgument);
        std::operator<<(poVar5,"\n");
        std::__cxx11::ostringstream::str();
        cmSystemTools::Stdout((string *)&cm.MessageLogLevel);
        std::__cxx11::string::~string((string *)&cm.MessageLogLevel);
        std::__cxx11::ostringstream::~ostringstream(local_340);
      }
      this_local._4_4_ = 1;
    }
  }
  else {
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::operator<<((ostream *)local_198,"Re-run cmake no build system arguments\n");
      std::__cxx11::ostringstream::str();
      cmSystemTools::Stdout(&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream(local_198);
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int cmake::CheckBuildSystem()
{
  // We do not need to rerun CMake.  Check dependency integrity.
  const bool verbose = isCMakeVerbose();

  // This method will check the integrity of the build system if the
  // option was given on the command line.  It reads the given file to
  // determine whether CMake should rerun.

  // If no file is provided for the check, we have to rerun.
  if (this->CheckBuildSystemArgument.empty()) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake no build system arguments\n";
      cmSystemTools::Stdout(msg.str());
    }
    return 1;
  }

  // If the file provided does not exist, we have to rerun.
  if (!cmSystemTools::FileExists(this->CheckBuildSystemArgument)) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake missing file: " << this->CheckBuildSystemArgument
          << "\n";
      cmSystemTools::Stdout(msg.str());
    }
    return 1;
  }

  // Read the rerun check file and use it to decide whether to do the
  // global generate.
  // Actually, all we need is the `set` command.
  cmake cm(RoleScript, cmState::Unknown);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  if (!mf.ReadListFile(this->CheckBuildSystemArgument) ||
      cmSystemTools::GetErrorOccuredFlag()) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake error reading : " << this->CheckBuildSystemArgument
          << "\n";
      cmSystemTools::Stdout(msg.str());
    }
    // There was an error reading the file.  Just rerun.
    return 1;
  }

  if (this->ClearBuildSystem) {
    // Get the generator used for this build system.
    const char* genName = mf.GetDefinition("CMAKE_DEPENDS_GENERATOR");
    if (!genName || genName[0] == '\0') {
      genName = "Unix Makefiles";
    }

    // Create the generator and use it to clear the dependencies.
    std::unique_ptr<cmGlobalGenerator> ggd(
      this->CreateGlobalGenerator(genName));
    if (ggd) {
      cm.GetCurrentSnapshot().SetDefaultDefinitions();
      cmMakefile mfd(ggd.get(), cm.GetCurrentSnapshot());
      std::unique_ptr<cmLocalGenerator> lgd(ggd->CreateLocalGenerator(&mfd));
      lgd->ClearDependencies(&mfd, verbose);
    }
  }

  // If any byproduct of makefile generation is missing we must re-run.
  std::vector<std::string> products;
  if (const char* productStr = mf.GetDefinition("CMAKE_MAKEFILE_PRODUCTS")) {
    cmSystemTools::ExpandListArgument(productStr, products);
  }
  for (std::string const& p : products) {
    if (!(cmSystemTools::FileExists(p) || cmSystemTools::FileIsSymlink(p))) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake, missing byproduct: " << p << "\n";
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // Get the set of dependencies and outputs.
  std::vector<std::string> depends;
  std::vector<std::string> outputs;
  const char* dependsStr = mf.GetDefinition("CMAKE_MAKEFILE_DEPENDS");
  const char* outputsStr = mf.GetDefinition("CMAKE_MAKEFILE_OUTPUTS");
  if (dependsStr && outputsStr) {
    cmSystemTools::ExpandListArgument(dependsStr, depends);
    cmSystemTools::ExpandListArgument(outputsStr, outputs);
  }
  if (depends.empty() || outputs.empty()) {
    // Not enough information was provided to do the test.  Just rerun.
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake no CMAKE_MAKEFILE_DEPENDS "
             "or CMAKE_MAKEFILE_OUTPUTS :\n";
      cmSystemTools::Stdout(msg.str());
    }
    return 1;
  }

  // Find the newest dependency.
  std::vector<std::string>::iterator dep = depends.begin();
  std::string dep_newest = *dep++;
  for (; dep != depends.end(); ++dep) {
    int result = 0;
    if (this->FileTimeCache->Compare(dep_newest, *dep, &result)) {
      if (result < 0) {
        dep_newest = *dep;
      }
    } else {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake: build system dependency is missing\n";
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // Find the oldest output.
  std::vector<std::string>::iterator out = outputs.begin();
  std::string out_oldest = *out++;
  for (; out != outputs.end(); ++out) {
    int result = 0;
    if (this->FileTimeCache->Compare(out_oldest, *out, &result)) {
      if (result > 0) {
        out_oldest = *out;
      }
    } else {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake: build system output is missing\n";
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // If any output is older than any dependency then rerun.
  {
    int result = 0;
    if (!this->FileTimeCache->Compare(out_oldest, dep_newest, &result) ||
        result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake file: " << out_oldest
            << " older than: " << dep_newest << "\n";
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // No need to rerun.
  return 0;
}